

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O1

bool __thiscall
bssl::ssl_parse_extensions
          (bssl *this,CBS *cbs,uint8_t *out_alert,initializer_list<bssl::SSLExtension_*> extensions,
          bool ignore_unknown)

{
  int iVar1;
  ushort *puVar2;
  long lVar3;
  long lVar4;
  ushort *puVar5;
  bool bVar6;
  bool bVar7;
  uint16_t type;
  CBS copy;
  CBS data;
  ushort local_66;
  undefined4 local_64;
  iterator local_60;
  CBS local_58;
  CBS local_40;
  
  local_60 = extensions._M_array;
  local_64 = (undefined4)extensions._M_len;
  if (local_60 != (iterator)0x0) {
    lVar3 = 0;
    do {
      lVar4 = *(long *)(out_alert + lVar3);
      *(undefined1 *)(lVar4 + 3) = 0;
      *(undefined8 *)(lVar4 + 8) = 0;
      *(undefined8 *)(lVar4 + 0x10) = 0;
      if (*(char *)(lVar4 + 2) == '\0' && (char)extensions._M_len == '\x01') {
        __assert_fail("!ignore_unknown",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0xb5,
                      "bool bssl::ssl_parse_extensions(const CBS *, uint8_t *, std::initializer_list<SSLExtension *>, bool)"
                     );
      }
      lVar3 = lVar3 + 8;
    } while ((long)local_60 * 8 - lVar3 != 0);
  }
  local_58.data = *(uint8_t **)this;
  local_58.len = *(size_t *)(this + 8);
  bVar6 = local_58.len == 0;
  if (!bVar6) {
    lVar3 = (long)local_60 * 8;
    do {
      iVar1 = CBS_get_u16(&local_58,&local_66);
      if ((iVar1 == 0) || (iVar1 = CBS_get_u16_length_prefixed(&local_58,&local_40), iVar1 == 0)) {
        ERR_put_error(0x10,0,0xbe,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                      ,0xbf);
        *(undefined1 *)&cbs->data = 0x32;
LAB_00141664:
        bVar7 = true;
      }
      else {
        if (local_60 == (iterator)0x0) {
          puVar2 = (ushort *)0x0;
        }
        else {
          lVar4 = 0;
          puVar5 = (ushort *)0x0;
          do {
            puVar2 = *(ushort **)(out_alert + lVar4);
            if ((local_66 != *puVar2) || (bVar7 = true, (char)puVar2[1] == '\0')) {
              bVar7 = false;
              puVar2 = puVar5;
            }
          } while ((!bVar7) &&
                  (bVar7 = lVar3 + -8 != lVar4, lVar4 = lVar4 + 8, puVar5 = puVar2, bVar7));
        }
        if (puVar2 == (ushort *)0x0) {
          bVar7 = false;
          if ((char)local_64 == '\0') {
            ERR_put_error(0x10,0,0xde,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                          ,0xd0);
            ERR_add_error_dataf("extension %u",(ulong)local_66);
            *(undefined1 *)&cbs->data = 0x6e;
            goto LAB_00141664;
          }
        }
        else {
          if (*(char *)((long)puVar2 + 3) == '\x01') {
            ERR_put_error(0x10,0,0x101,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/handshake.cc"
                          ,0xd8);
            *(undefined1 *)&cbs->data = 0x2f;
            goto LAB_00141664;
          }
          *(undefined1 *)((long)puVar2 + 3) = 1;
          *(uint8_t **)(puVar2 + 4) = local_40.data;
          *(size_t *)(puVar2 + 8) = local_40.len;
          bVar7 = false;
        }
      }
    } while ((!bVar7) && (bVar6 = local_58.len == 0, !bVar6));
  }
  return bVar6;
}

Assistant:

bool ssl_parse_extensions(const CBS *cbs, uint8_t *out_alert,
                          std::initializer_list<SSLExtension *> extensions,
                          bool ignore_unknown) {
  // Reset everything.
  for (SSLExtension *ext : extensions) {
    ext->present = false;
    CBS_init(&ext->data, nullptr, 0);
    if (!ext->allowed) {
      assert(!ignore_unknown);
    }
  }

  CBS copy = *cbs;
  while (CBS_len(&copy) != 0) {
    uint16_t type;
    CBS data;
    if (!CBS_get_u16(&copy, &type) ||
        !CBS_get_u16_length_prefixed(&copy, &data)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_PARSE_TLSEXT);
      *out_alert = SSL_AD_DECODE_ERROR;
      return false;
    }

    SSLExtension *found = nullptr;
    for (SSLExtension *ext : extensions) {
      if (type == ext->type && ext->allowed) {
        found = ext;
        break;
      }
    }

    if (found == nullptr) {
      if (ignore_unknown) {
        continue;
      }
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
      ERR_add_error_dataf("extension %u", unsigned{type});
      *out_alert = SSL_AD_UNSUPPORTED_EXTENSION;
      return false;
    }

    // Duplicate ext_types are forbidden.
    if (found->present) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DUPLICATE_EXTENSION);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }

    found->present = true;
    found->data = data;
  }

  return true;
}